

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_version_details.c
# Opt level: O3

char * archive_libpcre_version(void)

{
  return (char *)0x0;
}

Assistant:

const char *
archive_libpcre_version(void)
{
#if HAVE_LIBPCREPOSIX && HAVE_PCRE_H
#define str(s) #s
#define NUMBER(x) str(x)
	return NUMBER(PCRE_MAJOR) "." NUMBER(PCRE_MINOR);
#undef NUMBER
#undef str
#else
	return NULL;
#endif
}